

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O2

void __thiscall
test::spi_test::iu_SPITest_x_iutest_x_NonFatalFailure_Test::
~iu_SPITest_x_iutest_x_NonFatalFailure_Test(iu_SPITest_x_iutest_x_NonFatalFailure_Test *this)

{
  SPITest::~SPITest(&this->super_SPITest);
  operator_delete(this,0x150);
  return;
}

Assistant:

IUTEST_F(SPITest, NonFatalFailure)
{
    #define FLAVOR(n) IUTEST_EXPECT##n
    #define FAILURE_MACRO IUTEST_ASSERT_NONFATAL_FAILURE

#include "spi_tests_decl.cpp"

    #undef FLAVOR
    #undef FAILURE_MACRO
}